

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib.c
# Opt level: O1

void zlib_compress_block(ssh_compressor *sc,uchar *block,int len,uchar **outblock,int *outlen,
                        int minlen)

{
  uchar uVar1;
  ssh_compression_alg *out;
  LZ77InternalContext *st;
  bool bVar2;
  strbuf *psVar3;
  long lVar4;
  ulong uVar5;
  short sVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  uchar *puVar10;
  uchar *puVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  uchar *puVar18;
  int iVar19;
  Match matches [32];
  uint local_17c;
  ulong local_178;
  uint local_138 [66];
  
  out = sc[-3].vt;
  if ((strbuf *)out->name != (strbuf *)0x0) {
    __assert_fail("!out->outbuf",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0x269,
                  "void zlib_compress_block(ssh_compressor *, const unsigned char *, int, unsigned char **, int *, int)"
                 );
  }
  psVar3 = strbuf_new_nm();
  out->name = (char *)psVar3;
  if (*(_Bool *)((long)&out->compress_new + 4) == true) {
    outbits((Outbuf *)out,0x9c78,0x10);
    *(_Bool *)((long)&out->compress_new + 4) = false;
    outbits((Outbuf *)out,2,3);
  }
  st = (LZ77InternalContext *)sc[-4].vt;
  uVar7 = st->npending;
  uVar5 = (ulong)uVar7;
  if (3 < (int)uVar7) {
    __assert_fail("st->npending <= HASHCHARS",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c",
                  0xba,"void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
  }
  if ((int)uVar7 < 1) {
    lVar9 = 0;
  }
  else {
    puVar18 = st->pending;
    lVar9 = 0;
    puVar11 = block;
    do {
      iVar17 = (int)uVar5;
      iVar19 = (len - (int)lVar9) + iVar17;
      if (iVar19 < 3) {
        if (lVar9 < st->npending) {
          lVar4 = 0;
          lVar8 = lVar9;
          do {
            st->pending[lVar4] = st->pending[lVar8];
            lVar8 = lVar8 + 1;
            lVar4 = lVar4 + 1;
          } while (lVar8 < st->npending);
        }
      }
      else {
        lVar8 = 0;
        do {
          puVar10 = puVar11 + -(long)iVar17;
          if (lVar9 + lVar8 < (long)iVar17) {
            puVar10 = puVar18;
          }
          *(uchar *)((long)local_138 + lVar8) = puVar10[lVar8];
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        lz77_advance(st,(uchar)local_138[0],
                     ((local_138[0] >> 0x10 & 0xff) * 0x10d +
                     (local_138[0] >> 8 & 0xff) * 0x107 +
                     (uint)CONCAT11((uchar)local_138[0],(uchar)local_138[0])) % 0x7f7);
      }
      if (iVar19 < 3) break;
      lVar9 = lVar9 + 1;
      uVar5 = (ulong)st->npending;
      puVar11 = puVar11 + 1;
      puVar18 = puVar18 + 1;
    } while (lVar9 < (long)uVar5);
  }
  st->npending = st->npending - (int)lVar9;
  if (0 < len) {
    local_17c = 0;
    local_178 = 0;
    do {
      uVar7 = 0;
      if (2 < len) {
        sVar6 = st->hashtab
                [((uint)block[2] * 0x10d + (uint)block[1] * 0x107 + (uint)CONCAT11(*block,*block)) %
                 0x7f7].first;
        uVar7 = 0;
        if (sVar6 != -1) {
          iVar17 = st->winpos;
          uVar7 = 0;
          do {
            iVar19 = sVar6 - iVar17;
            uVar16 = iVar19 + 0xffff;
            if (-1 < (int)(iVar19 + 0x8000U)) {
              uVar16 = iVar19 + 0x8000U;
            }
            iVar19 = iVar19 - (uVar16 & 0xffff8000);
            iVar14 = iVar19 + 0x8000;
            lVar9 = 0;
            do {
              uVar16 = iVar19 + (int)lVar9;
              puVar18 = block + uVar16;
              if ((int)uVar16 < 0) {
                puVar18 = st->data + (iVar17 + iVar14 + (int)lVar9 & 0x7fff);
              }
              if (block[lVar9] != *puVar18) goto LAB_00101b56;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 3);
            lVar9 = 3;
LAB_00101b56:
            if ((int)lVar9 == 3) {
              local_138[(long)(int)uVar7 * 2] = 0x8000 - iVar14;
              local_138[(long)(int)uVar7 * 2 + 1] = 3;
              uVar16 = uVar7 + 1;
              bVar2 = 0x1e < (int)uVar7;
              uVar7 = uVar16;
              if (bVar2) break;
            }
            sVar6 = st->win[sVar6].next;
          } while (sVar6 != -1);
        }
      }
      iVar17 = (int)local_178;
      if ((int)uVar7 < 1) {
        if (iVar17 < 1) {
          (*(code *)sc[-2].vt)();
          iVar17 = 1;
        }
        else {
LAB_00101c75:
          (*(code *)sc[-1].vt)(sc + -4,local_17c,local_178);
          iVar17 = iVar17 + -1;
          local_178 = 0;
        }
      }
      else {
        uVar5 = 3;
        if (3 < len) {
          uVar5 = (ulong)(uint)len;
        }
        uVar13 = 3;
        do {
          uVar12 = uVar13;
          if (uVar12 == uVar5) goto LAB_00101c14;
          if ((int)uVar7 < 1) {
            uVar7 = 0;
          }
          else {
            uVar13 = (ulong)uVar7;
            uVar15 = 0;
            uVar7 = 0;
            do {
              uVar16 = (int)uVar12 - local_138[uVar15 * 2];
              if ((int)uVar16 < 0) {
                puVar18 = st->data + (uVar16 + st->winpos & 0x7fff);
              }
              else {
                puVar18 = block + uVar16;
              }
              if (block[uVar12] == *puVar18) {
                lVar9 = (long)(int)uVar7;
                uVar7 = uVar7 + 1;
                *(undefined8 *)(local_138 + lVar9 * 2) = *(undefined8 *)(local_138 + uVar15 * 2);
              }
              uVar15 = uVar15 + 1;
            } while (uVar13 != uVar15);
          }
          uVar13 = uVar12 + 1;
        } while (uVar7 != 0);
        uVar5 = uVar12 & 0xffffffff;
LAB_00101c14:
        local_138[1] = (int)uVar5;
        if (0 < iVar17) {
          if ((int)uVar5 <= iVar17 + 1) goto LAB_00101c75;
          (*(code *)sc[-2].vt)();
        }
        local_17c = local_138[0];
        iVar17 = 1;
        local_178 = uVar5;
      }
      uVar7 = len;
      if (0 < iVar17) {
        uVar7 = len - iVar17;
        iVar17 = iVar17 + 1;
        do {
          if (len < 3) {
            iVar19 = st->npending;
            if (2 < (long)iVar19) {
              __assert_fail("st->npending < HASHCHARS",
                            "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/zlib.c"
                            ,0x140,
                            "void lz77_compress(struct LZ77Context *, const unsigned char *, int)");
            }
            uVar1 = *block;
            st->npending = iVar19 + 1;
            st->pending[iVar19] = uVar1;
          }
          else {
            uVar1 = *block;
            lz77_advance(st,uVar1,((uint)block[2] * 0x10d +
                                  (uint)block[1] * 0x107 + (uint)CONCAT11(uVar1,uVar1)) % 0x7f7);
          }
          block = block + 1;
          len = len - 1;
          iVar17 = iVar17 + -1;
        } while (1 < iVar17);
      }
      len = uVar7;
    } while (0 < len);
  }
  outbits((Outbuf *)out,0,7);
  outbits((Outbuf *)out,2,10);
  outbits((Outbuf *)out,2,3);
  while( true ) {
    psVar3 = (strbuf *)out->name;
    uVar5 = psVar3->len;
    if ((ulong)(long)minlen <= uVar5) break;
    outbits((Outbuf *)out,0,7);
    outbits((Outbuf *)out,2,3);
  }
  *outlen = (int)uVar5;
  puVar18 = (uchar *)strbuf_to_str(psVar3);
  *outblock = puVar18;
  out->name = (char *)0x0;
  return;
}

Assistant:

void zlib_compress_block(ssh_compressor *sc,
                         const unsigned char *block, int len,
                         unsigned char **outblock, int *outlen,
                         int minlen)
{
    struct ssh_zlib_compressor *comp =
        container_of(sc, struct ssh_zlib_compressor, sc);
    struct Outbuf *out = (struct Outbuf *) comp->ectx.userdata;
    bool in_block;

    assert(!out->outbuf);
    out->outbuf = strbuf_new_nm();

    /*
     * If this is the first block, output the Zlib (RFC1950) header
     * bytes 78 9C. (Deflate compression, 32K window size, default
     * algorithm.)
     */
    if (out->firstblock) {
        outbits(out, 0x9C78, 16);
        out->firstblock = false;

        in_block = false;
    } else
        in_block = true;

    if (!in_block) {
        /*
         * Start a Deflate (RFC1951) fixed-trees block. We
         * transmit a zero bit (BFINAL=0), followed by a zero
         * bit and a one bit (BTYPE=01). Of course these are in
         * the wrong order (01 0).
         */
        outbits(out, 2, 3);
    }

    /*
     * Do the compression.
     */
    lz77_compress(&comp->ectx, block, len);

    /*
     * End the block (by transmitting code 256, which is
     * 0000000 in fixed-tree mode), and transmit some empty
     * blocks to ensure we have emitted the byte containing the
     * last piece of genuine data. There are three ways we can
     * do this:
     *
     *  - Minimal flush. Output end-of-block and then open a
     *    new static block. This takes 9 bits, which is
     *    guaranteed to flush out the last genuine code in the
     *    closed block; but allegedly zlib can't handle it.
     *
     *  - Zlib partial flush. Output EOB, open and close an
     *    empty static block, and _then_ open the new block.
     *    This is the best zlib can handle.
     *
     *  - Zlib sync flush. Output EOB, then an empty
     *    _uncompressed_ block (000, then sync to byte
     *    boundary, then send bytes 00 00 FF FF). Then open the
     *    new block.
     *
     * For the moment, we will use Zlib partial flush.
     */
    outbits(out, 0, 7);        /* close block */
    outbits(out, 2, 3 + 7);    /* empty static block */
    outbits(out, 2, 3);        /* open new block */

    /*
     * If we've been asked to pad out the compressed data until it's
     * at least a given length, do so by emitting further empty static
     * blocks.
     */
    while (out->outbuf->len < minlen) {
        outbits(out, 0, 7);            /* close block */
        outbits(out, 2, 3);            /* open new static block */
    }

    *outlen = out->outbuf->len;
    *outblock = (unsigned char *)strbuf_to_str(out->outbuf);
    out->outbuf = NULL;
}